

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lincost.cc
# Opt level: O3

size_t __thiscall bsplib::LinCost::get_bruck_vol(LinCost *this)

{
  iterator __position;
  long lVar1;
  unsigned_long uVar2;
  int iVar3;
  ulong uVar4;
  pointer puVar5;
  size_t sVar6;
  pointer puVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_78;
  unsigned_long local_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  ulong uVar11;
  
  if (this->m_nprocs == 1) {
    sVar6 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1];
  }
  else {
    puVar5 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar5 == puVar7) {
      uVar4 = 0;
    }
    else {
      uVar4 = (long)puVar7 - (long)puVar5 >> 3;
      lVar13 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar5,puVar7,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar5);
      puVar5 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar7 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar4 = 0;
      if ((long)puVar7 - (long)puVar5 != 0) {
        uVar8 = (long)puVar7 - (long)puVar5 >> 3;
        uVar10 = 0;
        uVar12 = 0;
        do {
          uVar2 = 1;
          do {
            local_60 = uVar2;
            uVar9 = uVar12 + (int)local_60;
            uVar11 = (ulong)uVar9;
            if (uVar8 <= uVar11) break;
            uVar2 = (ulong)((int)local_60 + 1);
          } while (puVar5[uVar10] == puVar5[uVar11]);
          __position._M_current =
               (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(&this->m_counts,__position,&local_60);
            puVar5 = (this->m_sizes).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar7 = (this->m_sizes).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          else {
            *__position._M_current = local_60;
            (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          puVar5[uVar4] = puVar5[uVar10];
          uVar16 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar16;
          uVar8 = (long)puVar7 - (long)puVar5 >> 3;
          uVar10 = uVar11;
          uVar12 = uVar9;
        } while (uVar11 < uVar8);
        uVar4 = (ulong)uVar16;
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_sizes,uVar4);
    puVar5 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3 != uVar4) {
      __assert_fail("m_counts.size() == k",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/lincost.cc"
                    ,0x2f,"std::size_t bsplib::LinCost::get_bruck_vol()");
    }
    if (*(this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start != 0) {
      __assert_fail("m_sizes[0] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/lincost.cc"
                    ,0x30,"std::size_t bsplib::LinCost::get_bruck_vol()");
    }
    if (*puVar5 == 0) {
      __assert_fail("m_counts[0] >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/lincost.cc"
                    ,0x31,"std::size_t bsplib::LinCost::get_bruck_vol()");
    }
    *puVar5 = *puVar5 - 1;
    iVar3 = uint32_log2(this->m_nprocs - 1);
    puVar5 = (this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(this->m_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3;
    if (uVar4 < 2) {
      sVar15 = 0;
      local_48 = ZEXT816(0);
      local_58 = 1.79769313486232e+308;
      dStack_50 = 0.0;
      local_78 = 0.0;
    }
    else {
      lVar13 = 0;
      lVar14 = 0;
      sVar15 = 0;
      dVar19 = 1.79769313486232e+308;
      do {
        sVar6 = puVar5[uVar4 - 1];
        auVar20._8_4_ = (int)(sVar6 >> 0x20);
        auVar20._0_8_ = sVar6;
        auVar20._12_4_ = 0x45300000;
        auVar21._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar21._0_8_ = lVar13;
        auVar21._12_4_ = 0x45300000;
        auVar22._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar22._0_8_ = lVar14;
        auVar22._12_4_ = 0x45300000;
        dStack_50 = auVar22._8_8_ - 1.9342813113834067e+25;
        local_58 = (dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) *
                   this->m_beta +
                   ((auVar21._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) * this->m_alpha
                   + (((auVar20._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0)) *
                      (double)this->m_nprocs * this->m_beta + this->m_alpha) * (double)(iVar3 + 1);
        if (local_58 < dVar19) {
          sVar15 = sVar6;
        }
        lVar13 = lVar13 + (this->m_counts).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4 - 1];
        lVar1 = uVar4 - 2;
        uVar4 = uVar4 - 1;
        if (dVar19 <= local_58) {
          local_58 = dVar19;
        }
        lVar14 = (sVar6 - puVar5[lVar1]) * lVar13 + lVar14;
        dVar19 = local_58;
      } while (1 < uVar4);
      auVar17._8_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar17._0_8_ = lVar13;
      auVar17._12_4_ = 0x45300000;
      local_78 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
      auVar18._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar18._0_8_ = lVar14;
      auVar18._12_4_ = 0x45300000;
      dVar19 = auVar18._8_8_ - 1.9342813113834067e+25;
      local_48._8_4_ = SUB84(dVar19,0);
      local_48._0_8_ = dVar19 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
      local_48._12_4_ = (int)((ulong)dVar19 >> 0x20);
    }
    reset(this,this->m_nprocs);
    sVar6 = 0;
    if (local_58 <= local_78 * this->m_alpha + (double)local_48._0_8_ * this->m_beta) {
      sVar6 = sVar15;
    }
  }
  return sVar6;
}

Assistant:

std::size_t LinCost::get_bruck_vol()
{
    if ( m_nprocs == 1 ) return m_sizes.back();

    // Make sure the list m_sizes consists of unique numbers, sorted in
    // increasing order, while m_counts contains the multiplicity
    std::sort( m_sizes.begin(), m_sizes.end() );
    unsigned k = 0;
    for ( unsigned i = 0, j=0; i < m_sizes.size(); i=j ) {

        for (j=i+1 ; j < m_sizes.size(); ++j ) 
            if ( m_sizes[i] != m_sizes[j] )
                break;

        m_counts.push_back( j-i );
        m_sizes[k] = m_sizes[i];
        k++;
    }
    m_sizes.resize(k);
    assert( m_counts.size() == k );
    assert( m_sizes[0] == 0 );
    assert( m_counts[0] >= 1);
    m_counts[0] -= 1; // remove one occurrence of zero


    // now we can find the minimum cost
    double min_cost = std::numeric_limits<double>::max();
    std::size_t min_m = 0;
    std::size_t p2p_volume = 0, relation = 0;
    int logP = 1 + int_log2( m_nprocs-1 );
    for ( std::size_t i = m_sizes.size(); i > 1; --i ) {
        std::size_t m = m_sizes[i-1];

        double cost = logP * ( m_alpha + m_beta * m_nprocs * m ) + 
            relation * m_alpha + p2p_volume * m_beta;

        if (cost < min_cost) {
            min_cost = cost;
            min_m = m;
        }

        relation += m_counts[i-1];
        std::size_t next_m = m_sizes[i-2];
        p2p_volume += relation * (m - next_m);
    }
    reset(m_nprocs);
    // now test for m = zero
    if ( relation * m_alpha + p2p_volume * m_beta < min_cost ) {
        return 0;
    }
    return min_m;
}